

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O1

int __thiscall UdpLayer::okay(UdpLayer *this)

{
  int iVar1;
  uint uVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->sockMtx);
  iVar1 = this->errorState;
  uVar2 = 1;
  if ((iVar1 != 0) && (iVar1 != 0xb)) {
    uVar2 = (uint)(iVar1 == 0x73);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sockMtx);
  return uVar2;
}

Assistant:

int UdpLayer::okay() {
	sockMtx.lock();   /********** LOCK MUTEX *********/

	bool nonFatalError = ((errorState == 0) ||
				(errorState == EAGAIN) ||
				(errorState == EINPROGRESS));

	sockMtx.unlock(); /******** UNLOCK MUTEX *********/

#ifdef DEBUG_UDP_LAYER
	if (!nonFatalError) {
		std::cerr << "UdpLayer::NOT okay(): Error: " << errorState << std::endl;
	}

#endif

	return nonFatalError;
}